

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O1

bool __thiscall iDynTree::optimalcontrol::TimeRange::isInRange(TimeRange *this,double time)

{
  char cVar1;
  byte bVar2;
  double local_18;
  
  bVar2 = 1;
  if (this->m_anyTime == false) {
    local_18 = time;
    cVar1 = iDynTree::checkDoublesAreEqual(&this->m_initTime,&this->m_endTime,DEFAULT_TOL);
    if (cVar1 == '\0') {
      bVar2 = -(local_18 <= this->m_endTime) & -(this->m_initTime <= local_18);
    }
    else {
      bVar2 = iDynTree::checkDoublesAreEqual(&this->m_initTime,&local_18,DEFAULT_TOL);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool TimeRange::isInRange(double time) const
        {
            if (m_anyTime) {
                return true;
            }

            if (isInstant()) {
                return checkDoublesAreEqual(m_initTime, time);
            }

            return ((m_initTime <= time) && (m_endTime >= time));
        }